

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

EncodingInfo getUnicodeEncoding(StringRef Input)

{
  char cVar1;
  EncodingInfo EVar2;
  int local_158 [2];
  pair<UnicodeEncodingForm,_int> local_150;
  int local_148 [2];
  pair<UnicodeEncodingForm,_int> local_140;
  int local_138 [2];
  pair<UnicodeEncodingForm,_int> local_130;
  int local_128 [2];
  pair<UnicodeEncodingForm,_int> local_120;
  int local_118 [2];
  pair<UnicodeEncodingForm,_int> local_110;
  int local_108 [2];
  pair<UnicodeEncodingForm,_int> local_100;
  int local_f8 [2];
  pair<UnicodeEncodingForm,_int> local_f0;
  int local_e8 [2];
  pair<UnicodeEncodingForm,_int> local_e0;
  int local_d8 [2];
  pair<UnicodeEncodingForm,_int> local_d0;
  int local_c8 [2];
  pair<UnicodeEncodingForm,_int> local_c0;
  int local_b8 [2];
  pair<UnicodeEncodingForm,_int> local_b0;
  int local_a8 [2];
  pair<UnicodeEncodingForm,_int> local_a0;
  int local_98 [2];
  pair<UnicodeEncodingForm,_int> local_90;
  int local_88 [2];
  pair<UnicodeEncodingForm,_int> local_80;
  int local_78 [2];
  pair<UnicodeEncodingForm,_int> local_70;
  undefined1 local_68 [8];
  StringRef Input_local;
  EncodingInfo EVar3;
  EncodingInfo EVar4;
  
  Input_local.Data = (char *)Input.Length;
  local_68 = (undefined1  [8])Input.Data;
  if (Input_local.Data == (char *)0x0) {
    local_78[1] = 5;
    local_78[0] = 0;
    local_70 = std::make_pair<UnicodeEncodingForm,int>
                         ((UnicodeEncodingForm *)(local_78 + 1),local_78);
    std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
              ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_70);
  }
  else {
    cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,0);
    if (cVar1 == '\0') {
      if ((char *)0x3 < Input_local.Data) {
        cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1);
        if (((cVar1 == '\0') &&
            (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,2), cVar1 == -2)) &&
           (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,3), cVar1 == -1)) {
          local_88[1] = 1;
          local_88[0] = 4;
          local_80 = std::make_pair<UnicodeEncodingForm,int>
                               ((UnicodeEncodingForm *)(local_88 + 1),local_88);
          std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                    ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_80);
          EVar4.first = (undefined4)Input_local.Length;
          EVar4.second = Input_local.Length._4_4_;
          return EVar4;
        }
        cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1);
        if (((cVar1 == '\0') &&
            (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,2), cVar1 == '\0')) &&
           (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,3), cVar1 != '\0')) {
          local_98[1] = 1;
          local_98[0] = 0;
          local_90 = std::make_pair<UnicodeEncodingForm,int>
                               ((UnicodeEncodingForm *)(local_98 + 1),local_98);
          std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                    ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_90);
          EVar3.first = (undefined4)Input_local.Length;
          EVar3.second = Input_local.Length._4_4_;
          return EVar3;
        }
      }
      if ((Input_local.Data < (char *)0x2) ||
         (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 == '\0')) {
        local_b8[1] = 5;
        local_b8[0] = 0;
        local_b0 = std::make_pair<UnicodeEncodingForm,int>
                             ((UnicodeEncodingForm *)(local_b8 + 1),local_b8);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_b0);
      }
      else {
        local_a8[1] = 3;
        local_a8[0] = 0;
        local_a0 = std::make_pair<UnicodeEncodingForm,int>
                             ((UnicodeEncodingForm *)(local_a8 + 1),local_a8);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_a0);
      }
    }
    else if (cVar1 == -0x11) {
      if (((Input_local.Data < (char *)0x3) ||
          (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != -0x45)) ||
         (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,2), cVar1 != -0x41)) {
        local_128[1] = 5;
        local_128[0] = 0;
        local_120 = std::make_pair<UnicodeEncodingForm,int>
                              ((UnicodeEncodingForm *)(local_128 + 1),local_128);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_120);
      }
      else {
        local_118[1] = 4;
        local_118[0] = 3;
        local_110 = std::make_pair<UnicodeEncodingForm,int>
                              ((UnicodeEncodingForm *)(local_118 + 1),local_118);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_110);
      }
    }
    else if (cVar1 == -2) {
      if ((Input_local.Data < (char *)0x2) ||
         (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != -1)) {
        local_108[1] = 5;
        local_108[0] = 0;
        local_100 = std::make_pair<UnicodeEncodingForm,int>
                              ((UnicodeEncodingForm *)(local_108 + 1),local_108);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_100);
      }
      else {
        local_f8[1] = 3;
        local_f8[0] = 2;
        local_f0 = std::make_pair<UnicodeEncodingForm,int>
                             ((UnicodeEncodingForm *)(local_f8 + 1),local_f8);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_f0);
      }
    }
    else if (cVar1 == -1) {
      if (((Input_local.Data < (char *)0x4) ||
          (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != -2)) ||
         ((cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,2), cVar1 != '\0' ||
          (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,3), cVar1 != '\0')))) {
        if ((Input_local.Data < (char *)0x2) ||
           (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != -2)) {
          local_e8[1] = 5;
          local_e8[0] = 0;
          local_e0 = std::make_pair<UnicodeEncodingForm,int>
                               ((UnicodeEncodingForm *)(local_e8 + 1),local_e8);
          std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                    ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_e0);
        }
        else {
          local_d8[1] = 2;
          local_d8[0] = 2;
          local_d0 = std::make_pair<UnicodeEncodingForm,int>
                               ((UnicodeEncodingForm *)(local_d8 + 1),local_d8);
          std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                    ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_d0);
        }
      }
      else {
        local_c8[1] = 0;
        local_c8[0] = 4;
        local_c0 = std::make_pair<UnicodeEncodingForm,int>
                             ((UnicodeEncodingForm *)(local_c8 + 1),local_c8);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_c0);
      }
    }
    else if ((((Input_local.Data < (char *)0x4) ||
              (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != '\0')) ||
             (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,2), cVar1 != '\0')) ||
            (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,3), cVar1 != '\0')) {
      if ((Input_local.Data < (char *)0x2) ||
         (cVar1 = llvm::StringRef::operator[]((StringRef *)local_68,1), cVar1 != '\0')) {
        local_158[1] = 4;
        local_158[0] = 0;
        local_150 = std::make_pair<UnicodeEncodingForm,int>
                              ((UnicodeEncodingForm *)(local_158 + 1),local_158);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_150);
      }
      else {
        local_148[1] = 2;
        local_148[0] = 0;
        local_140 = std::make_pair<UnicodeEncodingForm,int>
                              ((UnicodeEncodingForm *)(local_148 + 1),local_148);
        std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                  ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_140);
      }
    }
    else {
      local_138[1] = 0;
      local_138[0] = 0;
      local_130 = std::make_pair<UnicodeEncodingForm,int>
                            ((UnicodeEncodingForm *)(local_138 + 1),local_138);
      std::pair<UnicodeEncodingForm,_unsigned_int>::pair<UnicodeEncodingForm,_int,_true>
                ((pair<UnicodeEncodingForm,_unsigned_int> *)&Input_local.Length,&local_130);
    }
  }
  EVar2.first = (undefined4)Input_local.Length;
  EVar2.second = Input_local.Length._4_4_;
  return EVar2;
}

Assistant:

static EncodingInfo getUnicodeEncoding(StringRef Input) {
  if (Input.empty())
    return std::make_pair(UEF_Unknown, 0);

  switch (uint8_t(Input[0])) {
  case 0x00:
    if (Input.size() >= 4) {
      if (  Input[1] == 0
         && uint8_t(Input[2]) == 0xFE
         && uint8_t(Input[3]) == 0xFF)
        return std::make_pair(UEF_UTF32_BE, 4);
      if (Input[1] == 0 && Input[2] == 0 && Input[3] != 0)
        return std::make_pair(UEF_UTF32_BE, 0);
    }

    if (Input.size() >= 2 && Input[1] != 0)
      return std::make_pair(UEF_UTF16_BE, 0);
    return std::make_pair(UEF_Unknown, 0);
  case 0xFF:
    if (  Input.size() >= 4
       && uint8_t(Input[1]) == 0xFE
       && Input[2] == 0
       && Input[3] == 0)
      return std::make_pair(UEF_UTF32_LE, 4);

    if (Input.size() >= 2 && uint8_t(Input[1]) == 0xFE)
      return std::make_pair(UEF_UTF16_LE, 2);
    return std::make_pair(UEF_Unknown, 0);
  case 0xFE:
    if (Input.size() >= 2 && uint8_t(Input[1]) == 0xFF)
      return std::make_pair(UEF_UTF16_BE, 2);
    return std::make_pair(UEF_Unknown, 0);
  case 0xEF:
    if (  Input.size() >= 3
       && uint8_t(Input[1]) == 0xBB
       && uint8_t(Input[2]) == 0xBF)
      return std::make_pair(UEF_UTF8, 3);
    return std::make_pair(UEF_Unknown, 0);
  }

  // It could still be utf-32 or utf-16.
  if (Input.size() >= 4 && Input[1] == 0 && Input[2] == 0 && Input[3] == 0)
    return std::make_pair(UEF_UTF32_LE, 0);

  if (Input.size() >= 2 && Input[1] == 0)
    return std::make_pair(UEF_UTF16_LE, 0);

  return std::make_pair(UEF_UTF8, 0);
}